

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo_linux.cpp
# Opt level: O0

quint64 mountIdForPath(int fd)

{
  int iVar1;
  int in_EDI;
  long in_FS_OFFSET;
  int r;
  statx st;
  quint64 local_110;
  uint local_108 [36];
  quint64 local_78;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDI < 0) {
    local_110 = 0;
  }
  else {
    memset(local_108,0xaa,0x100);
    iVar1 = statx(in_EDI,"",0x1800,0x1000,local_108);
    if ((iVar1 == 0) && ((local_108[0] & 0x1000) != 0)) {
      local_110 = local_78;
    }
    else {
      local_110 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_110;
  }
  __stack_chk_fail();
}

Assistant:

static inline quint64 mountIdForPath(int fd)
{
    if (fd < 0)
        return 0;
#if defined(STATX_BASIC_STATS) && defined(STATX_MNT_ID)
    // STATX_MNT_ID was added in kernel v5.8
    struct statx st;
    int r = statx(fd, "", AT_EMPTY_PATH | AT_NO_AUTOMOUNT, STATX_MNT_ID, &st);
    if (r == 0 && (st.stx_mask & STATX_MNT_ID))
        return st.stx_mnt_id;
#endif
    return 0;
}